

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTimer.cpp
# Opt level: O3

void __thiscall helics::MessageTimer::cancelAll(MessageTimer *this)

{
  pointer pAVar1;
  pointer psVar2;
  int iVar3;
  ActionMessage *buf;
  pointer this_00;
  pointer psVar4;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->timerLock);
  if (iVar3 == 0) {
    pAVar1 = (this->buffers).
             super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (this_00 = (this->buffers).
                   super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_00 != pAVar1;
        this_00 = this_00 + 1) {
      ActionMessage::setAction(this_00,cmd_ignore);
    }
    psVar2 = (this->timers).
             super__Vector_base<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar4 = (this->timers).
                  super__Vector_base<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar2; psVar4 = psVar4 + 1)
    {
      ::asio::
      basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
      ::cancel((psVar4->
               super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->timerLock);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void MessageTimer::cancelAll()
{
    std::lock_guard<std::mutex> lock(timerLock);
    for (auto& buf : buffers) {
        buf.setAction(CMD_IGNORE);
    }
    for (auto& tmr : timers) {
        tmr->cancel();
    }
}